

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommandFactory
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,bool definition,CommandFlavourFlags flavourFlags)

{
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *params;
  _Rb_tree_header *p_Var1;
  size_type *psVar2;
  pointer puVar3;
  unsigned_long uVar4;
  pointer pPVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  bool singular;
  int iVar8;
  MemberData *pMVar9;
  long lVar10;
  _Base_ptr p_Var11;
  char *pcVar12;
  _Base_ptr p_Var13;
  _Rb_tree_header *p_Var14;
  VulkanHppGenerator *pVVar15;
  _Base_ptr p_Var16;
  char *pcVar17;
  _Base_ptr p_Var18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  size_type sVar20;
  bool bVar21;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  string noexceptString;
  allocator_type local_58a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_589;
  string className;
  string returnType;
  string handleType;
  string resultCheck;
  string vulkanType;
  long *local_4b0;
  size_type local_4a8;
  long local_4a0 [2];
  string commandName;
  string definitionTemplate;
  string returnVariable;
  string dataType;
  string argumentList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dataTypes;
  string returnStatements;
  string callSequence;
  string dataDeclarations;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_378;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_318;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skippedParams;
  string strippedValue;
  size_type sStack_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  
  params = &commandData->params;
  pVVar15 = (VulkanHppGenerator *)
            &(commandData->params).
             super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
             ._M_impl.super__Vector_impl_data._M_start
             [(returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
              _M_impl.super__Vector_impl_data._M_finish[-1]].type.type;
  bVar7 = isHandleType(this,(string *)pVVar15);
  if (!bVar7) {
    puVar3 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    p_Var13 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var11 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var16 = p_Var11;
    if (p_Var13 != (_Base_ptr)0x0) {
      p_Var18 = p_Var13;
      do {
        if (*(ulong *)(p_Var18 + 1) >= puVar3[-1]) {
          p_Var16 = p_Var18;
        }
        p_Var18 = (&p_Var18->_M_left)[*(ulong *)(p_Var18 + 1) < puVar3[-1]];
      } while (p_Var18 != (_Base_ptr)0x0);
    }
    p_Var18 = p_Var11;
    if ((p_Var16 != p_Var11) && (p_Var18 = p_Var16, puVar3[-1] < *(ulong *)(p_Var16 + 1))) {
      p_Var18 = p_Var11;
    }
    if (p_Var18 != p_Var11) {
      p_Var16 = p_Var11;
      if (p_Var13 != (_Base_ptr)0x0) {
        do {
          if (*(ulong *)(p_Var13 + 1) >= puVar3[-1]) {
            p_Var16 = p_Var13;
          }
          p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < puVar3[-1]];
        } while (p_Var13 != (_Base_ptr)0x0);
      }
      if ((p_Var16 != p_Var11) && (*(ulong *)(p_Var16 + 1) <= puVar3[-1])) {
        p_Var11 = p_Var16;
      }
      if (*(char *)&p_Var11[1]._M_right == '\x01') {
        pMVar9 = vectorMemberByStructure
                           (this,&(params->
                                  super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                  )._M_impl.super__Vector_impl_data._M_start[puVar3[-1]].type.type);
        pVVar15 = (VulkanHppGenerator *)&(pMVar9->type).type;
        bVar7 = isHandleType(this,(string *)pVVar15);
        if (bVar7) goto LAB_0016bff0;
      }
    }
    __assert_fail("isHandleType( commandData.params[returnParams.back()].type.type ) || ( vectorParams.contains( returnParams.back() ) && vectorParams.find( returnParams.back() )->second.byStructure && isHandleType( vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type ) )"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x243f,
                  "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                 );
  }
LAB_0016bff0:
  puVar3 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_start;
  lVar10 = (long)(returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
  if ((lVar10 != 1) &&
     ((((lVar10 != 2 || ((vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1)) ||
       (p_Var13 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
       (_Base_ptr)*puVar3 != p_Var13[1]._M_parent)) ||
      (puVar3[1] != *(unsigned_long *)(p_Var13 + 1))))) {
    __assert_fail("( returnParams.size() == 1 ) || ( ( returnParams.size() == 2 ) && ( vectorParams.size() == 1 ) && ( returnParams[0] == vectorParams.begin()->second.lenParam ) && ( returnParams[1] == vectorParams.begin()->first ) )"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x2442,
                  "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                 );
  }
  determineVoidPointerParams
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &strippedValue,pVVar15,params);
  if (sStack_290 != 0) {
    __assert_fail("determineVoidPointerParams( commandData.params ).empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x2443,
                  "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                 );
  }
  pVVar15 = (VulkanHppGenerator *)&strippedValue;
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)pVVar15);
  bVar7 = determineEnumeration(pVVar15,vectorParams,returnParams);
  singular = (bool)((flavourFlags.m_mask & 4) >> 2);
  pVVar15 = this;
  determineSkippedParams
            (&skippedParams,this,params,initialSkipCount,vectorParams,returnParams,singular);
  if ((flavourFlags.m_mask & 4) == 0) {
    local_378._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_378._M_impl.super__Rb_tree_header._M_header;
    local_378._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_378._M_impl._0_8_ = 0;
    local_378._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_378._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_378._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_378._M_impl.super__Rb_tree_header._M_header._M_right =
         local_378._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    determineSingularParams
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &local_378,pVVar15,
               (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish[-1],vectorParams);
  }
  generateRAIIHandleCommandFactoryArgumentList_abi_cxx11_
            (&argumentList,this,params,&skippedParams,definition,singular);
  generateCommandName(&commandName,this,name,params,initialSkipCount,flavourFlags);
  handleType._M_dataplus._M_p = (pointer)&handleType.field_2;
  handleType._M_string_length = 0;
  handleType.field_2._M_local_buf[0] = '\0';
  if (((vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 1) &&
     (p_Var13 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
     *(char *)&p_Var13[1]._M_right == '\x01')) {
    if (*(unsigned_long *)(p_Var13 + 1) !=
        (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish[-1]) {
      __assert_fail("vectorParams.begin()->first == returnParams.back()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x244f,
                    "std::string VulkanHppGenerator::generateRAIIHandleCommandFactory(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                   );
    }
    pMVar9 = vectorMemberByStructure
                       (this,&(commandData->params).
                              super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].type.type);
    noexceptString._M_dataplus._M_p = (pointer)&noexceptString.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&noexceptString,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE","");
    returnType._M_dataplus._M_p = (pointer)&returnType.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&returnType,"Vk","");
    TypeInfo::compose(&strippedValue,&pMVar9->type,&noexceptString,&returnType);
  }
  else {
    uVar4 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_finish[-1];
    pPVar5 = (params->
             super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
             )._M_impl.super__Vector_impl_data._M_start;
    noexceptString._M_dataplus._M_p = (pointer)&noexceptString.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&noexceptString,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE","");
    returnType._M_dataplus._M_p = (pointer)&returnType.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&returnType,"Vk","");
    TypeInfo::compose(&strippedValue,&pPVar5[uVar4].type,&noexceptString,&returnType);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&handleType,&strippedValue);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strippedValue._M_dataplus._M_p != &strippedValue.field_2) {
    operator_delete(strippedValue._M_dataplus._M_p,strippedValue.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)returnType._M_dataplus._M_p != &returnType.field_2) {
    operator_delete(returnType._M_dataplus._M_p,returnType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)noexceptString._M_dataplus._M_p != &noexceptString.field_2) {
    operator_delete(noexceptString._M_dataplus._M_p,noexceptString.field_2._M_allocated_capacity + 1
                   );
  }
  noexceptString._M_dataplus._M_p = (pointer)&noexceptString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&noexceptString," *","");
  strippedValue._M_dataplus._M_p = (pointer)&strippedValue.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&strippedValue,handleType._M_dataplus._M_p,
             handleType._M_dataplus._M_p + handleType._M_string_length);
  _Var6._M_p = strippedValue._M_dataplus._M_p;
  sVar20 = strippedValue._M_string_length - noexceptString._M_string_length;
  if ((noexceptString._M_string_length <= strippedValue._M_string_length) &&
     ((noexceptString._M_string_length == 0 ||
      (iVar8 = bcmp(strippedValue._M_dataplus._M_p +
                    (strippedValue._M_string_length - noexceptString._M_string_length),
                    noexceptString._M_dataplus._M_p,noexceptString._M_string_length), iVar8 == 0))))
  {
    _Var6._M_p[sVar20] = '\0';
    strippedValue._M_string_length = sVar20;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&handleType,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&strippedValue);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strippedValue._M_dataplus._M_p != &strippedValue.field_2) {
    operator_delete(strippedValue._M_dataplus._M_p,strippedValue.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)noexceptString._M_dataplus._M_p != &noexceptString.field_2) {
    operator_delete(noexceptString._M_dataplus._M_p,noexceptString.field_2._M_allocated_capacity + 1
                   );
  }
  pcVar17 = "VULKAN_HPP_RAII_CREATE_NOEXCEPT";
  if (bVar7) {
    pcVar17 = "";
  }
  pcVar12 = pcVar17 + 0x1f;
  if (bVar7) {
    pcVar12 = pcVar17;
  }
  noexceptString._M_dataplus._M_p = (pointer)&noexceptString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&noexceptString,pcVar17,pcVar12);
  returnType._M_dataplus._M_p = (pointer)&returnType.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&returnType,handleType._M_dataplus._M_p,
             handleType._M_dataplus._M_p + handleType._M_string_length);
  puVar3 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  p_Var13 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header;
  p_Var11 = &p_Var1->_M_header;
  if (p_Var13 != (_Base_ptr)0x0) {
    do {
      bVar21 = *(ulong *)(p_Var13 + 1) < puVar3[-1];
      if (!bVar21) {
        p_Var11 = p_Var13;
      }
      p_Var13 = (&p_Var13->_M_left)[bVar21];
    } while (p_Var13 != (_Base_ptr)0x0);
  }
  p_Var13 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
     (p_Var13 = p_Var11, puVar3[-1] < *(ulong *)(p_Var11 + 1))) {
    p_Var13 = &p_Var1->_M_header;
  }
  if (((flavourFlags.m_mask & 4) == 0) && ((_Rb_tree_header *)p_Var13 != p_Var1)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&noexceptString,0,noexceptString._M_string_length,"",0);
    std::operator+(&className,"std::vector<",&handleType);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&className,">");
    generateRAIIHandleCommandFactory();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&handleType,"s");
  }
  if (definition) {
    if (initialSkipCount == 0) {
      className._M_dataplus._M_p = (pointer)&className.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&className,"Context","");
    }
    else {
      pPVar5 = (params->
               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_4b0 = local_4a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"Vk","");
      className._M_dataplus._M_p = (pointer)&className.field_2;
      _Var6._M_p = pPVar5[initialSkipCount - 1].type.type._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&className,_Var6._M_p,
                 _Var6._M_p + pPVar5[initialSkipCount - 1].type.type._M_string_length);
      if ((local_4a8 <= className._M_string_length) &&
         ((local_4a8 == 0 ||
          (iVar8 = bcmp(className._M_dataplus._M_p,local_4b0,local_4a8), iVar8 == 0)))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&className,0,local_4a8);
      }
    }
    if ((initialSkipCount != 0) && (local_4b0 != local_4a0)) {
      operator_delete(local_4b0,local_4a0[0] + 1);
    }
    psVar2 = &strippedValue._M_string_length;
    strippedValue.field_2._M_allocated_capacity = 0;
    strippedValue._M_dataplus._M_p = (pointer)0x0;
    strippedValue._M_string_length = 0;
    pVVar15 = this;
    strippedValue.field_2._8_8_ = psVar2;
    determineDataTypes_abi_cxx11_
              (&dataTypes,this,params,vectorParams,returnParams,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &strippedValue);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&strippedValue);
    combineDataTypes(&dataType,pVVar15,vectorParams,returnParams,bVar7,&dataTypes,flavourFlags,true)
    ;
    generateReturnVariable_abi_cxx11_
              (&returnVariable,this,commandData,returnParams,vectorParams,flavourFlags);
    vulkanType._M_dataplus._M_p = (pointer)&vulkanType.field_2;
    vulkanType._M_string_length = 0;
    vulkanType.field_2._M_local_buf[0] = '\0';
    puVar3 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    p_Var13 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var11 = &p_Var1->_M_header;
    if (p_Var13 != (_Base_ptr)0x0) {
      do {
        if (*(ulong *)(p_Var13 + 1) >= puVar3[-1]) {
          p_Var11 = p_Var13;
        }
        p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < puVar3[-1]];
      } while (p_Var13 != (_Base_ptr)0x0);
    }
    p_Var14 = p_Var1;
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (p_Var14 = (_Rb_tree_header *)p_Var11,
       puVar3[-1] < ((_Rb_tree_header *)p_Var11)->_M_node_count)) {
      p_Var14 = p_Var1;
    }
    if ((p_Var14 == p_Var1) || (*(char *)((long)(p_Var14 + 1) + 0x10) != '\x01')) {
      pPVar5 = (params->
               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               )._M_impl.super__Vector_impl_data._M_start + puVar3[-1];
    }
    else {
      pMVar9 = vectorMemberByStructure
                         (this,&(params->
                                super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                )._M_impl.super__Vector_impl_data._M_start[puVar3[-1]].type.type);
      pPVar5 = (pointer)&pMVar9->type;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&vulkanType,&(pPVar5->type).type);
    strippedValue.field_2._M_allocated_capacity = 0;
    strippedValue._M_dataplus._M_p = (pointer)0x0;
    strippedValue._M_string_length = 0;
    strippedValue.field_2._8_8_ = psVar2;
    generateDataDeclarations
              (&dataDeclarations,this,commandData,returnParams,vectorParams,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &strippedValue,flavourFlags,true,&dataTypes,&dataType,&returnType,&returnVariable);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&strippedValue);
    strippedValue.field_2._M_allocated_capacity = 0;
    strippedValue._M_dataplus._M_p = (pointer)0x0;
    strippedValue._M_string_length = 0;
    resultCheck.field_2._M_allocated_capacity = 0;
    resultCheck._M_dataplus._M_p = (pointer)0x0;
    resultCheck._M_string_length = 0;
    strippedValue.field_2._8_8_ = psVar2;
    generateCallSequence
              (&callSequence,this,name,commandData,returnParams,vectorParams,initialSkipCount,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &local_378,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &strippedValue,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&resultCheck,
               flavourFlags,true,true);
    if (resultCheck._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(resultCheck._M_dataplus._M_p,
                      resultCheck.field_2._M_allocated_capacity - (long)resultCheck._M_dataplus._M_p
                     );
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&strippedValue);
    generateResultCheckExpected
              (&resultCheck,this,&commandData->successCodes,&className,&commandName);
    generateRAIIFactoryReturnStatements
              (&returnStatements,this,params,&commandData->successCodes,&vulkanType,bVar7,
               &returnType,&returnVariable,singular);
    definitionTemplate._M_dataplus._M_p = (pointer)&definitionTemplate.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&definitionTemplate,
               "\n  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n  VULKAN_HPP_NODISCARD VULKAN_HPP_INLINE VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${className}::${commandName}( ${argumentList} ) const ${noexcept}\n  {\n    ${dataDeclarations}\n    ${callSequence}\n    ${resultCheck}\n    ${returnStatements}\n  }\n"
               ,"");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&strippedValue,(char (*) [13])"argumentList",&argumentList);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_278,(char (*) [13])"callSequence",&callSequence);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_238,(char (*) [10])"className",&className);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_1f8,(char (*) [12])"commandName",&commandName);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_1b8,(char (*) [17])"dataDeclarations",&dataDeclarations);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_178,(char (*) [9])"noexcept",&noexceptString);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_138,(char (*) [12])"resultCheck",&resultCheck);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_f8,(char (*) [17])"returnStatements",&returnStatements);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_b8,(char (*) [11])"returnType",&returnType);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[14],_true>(&local_78,(char (*) [14])"vkCommandName",name);
    __l_00._M_len = 10;
    __l_00._M_array = (iterator)&strippedValue;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_318,__l_00,&local_589,&local_58a);
    replaceWithMap(__return_storage_ptr__,&definitionTemplate,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_318);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_318);
    lVar10 = -0x280;
    paVar19 = &local_78.second.field_2;
    do {
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar19->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar19->_M_allocated_capacity)[-2],
                        paVar19->_M_allocated_capacity + 1);
      }
      if (&paVar19->_M_allocated_capacity + -4 != (size_type *)(&paVar19->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar19->_M_allocated_capacity)[-6],
                        (&paVar19->_M_allocated_capacity)[-4] + 1);
      }
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar19->_M_allocated_capacity + -8);
      lVar10 = lVar10 + 0x40;
    } while (lVar10 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)definitionTemplate._M_dataplus._M_p != &definitionTemplate.field_2) {
      operator_delete(definitionTemplate._M_dataplus._M_p,
                      definitionTemplate.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)returnStatements._M_dataplus._M_p != &returnStatements.field_2) {
      operator_delete(returnStatements._M_dataplus._M_p,
                      returnStatements.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)resultCheck._M_dataplus._M_p != &resultCheck.field_2) {
      operator_delete(resultCheck._M_dataplus._M_p,resultCheck.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)callSequence._M_dataplus._M_p != &callSequence.field_2) {
      operator_delete(callSequence._M_dataplus._M_p,callSequence.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dataDeclarations._M_dataplus._M_p != &dataDeclarations.field_2) {
      operator_delete(dataDeclarations._M_dataplus._M_p,
                      dataDeclarations.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vulkanType._M_dataplus._M_p != &vulkanType.field_2) {
      operator_delete(vulkanType._M_dataplus._M_p,
                      CONCAT71(vulkanType.field_2._M_allocated_capacity._1_7_,
                               vulkanType.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)returnVariable._M_dataplus._M_p != &returnVariable.field_2) {
      operator_delete(returnVariable._M_dataplus._M_p,
                      returnVariable.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dataType._M_dataplus._M_p != &dataType.field_2) {
      operator_delete(dataType._M_dataplus._M_p,dataType.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dataTypes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)className._M_dataplus._M_p != &className.field_2) {
      operator_delete(className._M_dataplus._M_p,className.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    className._M_dataplus._M_p = (pointer)&className.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&className,
               "\n  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n  VULKAN_HPP_NODISCARD VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${commandName}( ${argumentList} ) const ${noexcept};\n"
               ,"");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&strippedValue,(char (*) [13])"argumentList",&argumentList);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_278,(char (*) [12])"commandName",&commandName);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_238,(char (*) [9])"noexcept",&noexceptString);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_1f8,(char (*) [11])"returnType",&returnType);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[14],_true>(&local_1b8,(char (*) [14])"vkCommandName",name);
    __l._M_len = 5;
    __l._M_array = (iterator)&strippedValue;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_348,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_4b0,(allocator_type *)&dataType);
    replaceWithMap(__return_storage_ptr__,&className,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_348);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_348);
    lVar10 = -0x140;
    paVar19 = &local_1b8.second.field_2;
    do {
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar19->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar19->_M_allocated_capacity)[-2],
                        paVar19->_M_allocated_capacity + 1);
      }
      if (&paVar19->_M_allocated_capacity + -4 != (size_type *)(&paVar19->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar19->_M_allocated_capacity)[-6],
                        (&paVar19->_M_allocated_capacity)[-4] + 1);
      }
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar19->_M_allocated_capacity + -8);
      lVar10 = lVar10 + 0x40;
    } while (lVar10 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)className._M_dataplus._M_p != &className.field_2) {
      operator_delete(className._M_dataplus._M_p,className.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)returnType._M_dataplus._M_p != &returnType.field_2) {
    operator_delete(returnType._M_dataplus._M_p,returnType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)noexceptString._M_dataplus._M_p != &noexceptString.field_2) {
    operator_delete(noexceptString._M_dataplus._M_p,noexceptString.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)handleType._M_dataplus._M_p != &handleType.field_2) {
    operator_delete(handleType._M_dataplus._M_p,
                    CONCAT71(handleType.field_2._M_allocated_capacity._1_7_,
                             handleType.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)commandName._M_dataplus._M_p != &commandName.field_2) {
    operator_delete(commandName._M_dataplus._M_p,commandName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argumentList._M_dataplus._M_p != &argumentList.field_2) {
    operator_delete(argumentList._M_dataplus._M_p,argumentList.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_378);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&skippedParams._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommandFactory( std::string const &                       name,
                                                                  CommandData const &                       commandData,
                                                                  size_t                                    initialSkipCount,
                                                                  std::vector<size_t> const &               returnParams,
                                                                  std::map<size_t, VectorParamData> const & vectorParams,
                                                                  bool                                      definition,
                                                                  CommandFlavourFlags                       flavourFlags ) const
{
  assert( isHandleType( commandData.params[returnParams.back()].type.type ) ||
          ( vectorParams.contains( returnParams.back() ) && vectorParams.find( returnParams.back() )->second.byStructure &&
            isHandleType( vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type ) ) );
  assert( ( returnParams.size() == 1 ) ||
          ( ( returnParams.size() == 2 ) && ( vectorParams.size() == 1 ) && ( returnParams[0] == vectorParams.begin()->second.lenParam ) &&
            ( returnParams[1] == vectorParams.begin()->first ) ) );
  assert( determineVoidPointerParams( commandData.params ).empty() );

  const bool       enumerating    = determineEnumeration( vectorParams, returnParams );
  const bool       singular       = flavourFlags & CommandFlavourFlagBits::singular;
  std::set<size_t> skippedParams  = determineSkippedParams( commandData.params, initialSkipCount, vectorParams, returnParams, singular );
  std::set<size_t> singularParams = singular ? determineSingularParams( returnParams.back(), vectorParams ) : std::set<size_t>();
  std::string      argumentList   = generateRAIIHandleCommandFactoryArgumentList( commandData.params, skippedParams, definition, singular );
  std::string      commandName    = generateCommandName( name, commandData.params, initialSkipCount, flavourFlags );

  std::string handleType;
  if ( ( vectorParams.size() == 1 ) && vectorParams.begin()->second.byStructure )
  {
    assert( vectorParams.begin()->first == returnParams.back() );
    handleType = vectorMemberByStructure( commandData.params.back().type.type ).type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE" );
  }
  else
  {
    handleType = commandData.params[returnParams.back()].type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE" );
  }
  handleType                 = stripPostfix( handleType, " *" );
  std::string noexceptString = enumerating ? "" : "VULKAN_HPP_RAII_CREATE_NOEXCEPT";
  std::string returnType     = handleType;
  if ( vectorParams.contains( returnParams.back() ) && !singular )
  {
    noexceptString = "";
    returnType     = "std::vector<" + handleType + ">";
    handleType += "s";
  }

  if ( definition )
  {
    std::string              className      = initialSkipCount ? stripPrefix( commandData.params[initialSkipCount - 1].type.type, "Vk" ) : "Context";
    std::vector<std::string> dataTypes      = determineDataTypes( commandData.params, vectorParams, returnParams, {} );
    std::string              dataType       = combineDataTypes( vectorParams, returnParams, enumerating, dataTypes, flavourFlags, true );
    std::string              returnVariable = generateReturnVariable( commandData, returnParams, vectorParams, flavourFlags );
    std::string              vulkanType;
    auto                     vectorParamIt = vectorParams.find( returnParams.back() );
    if ( ( vectorParamIt != vectorParams.end() ) && vectorParamIt->second.byStructure )
    {
      vulkanType = vectorMemberByStructure( commandData.params[returnParams.back()].type.type ).type.type;
    }
    else
    {
      vulkanType = commandData.params[returnParams.back()].type.type;
    }

    std::string dataDeclarations =
      generateDataDeclarations( commandData, returnParams, vectorParams, {}, flavourFlags, true, dataTypes, dataType, returnType, returnVariable );
    std::string callSequence =
      generateCallSequence( name, commandData, returnParams, vectorParams, initialSkipCount, singularParams, {}, {}, flavourFlags, true, true );
    std::string resultCheck = generateResultCheckExpected( commandData.successCodes, className, commandName );
    std::string returnStatements =
      generateRAIIFactoryReturnStatements( commandData.params, commandData.successCodes, vulkanType, enumerating, returnType, returnVariable, singular );

    std::string const definitionTemplate =
      R"(
  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
  VULKAN_HPP_NODISCARD VULKAN_HPP_INLINE VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${className}::${commandName}( ${argumentList} ) const ${noexcept}
  {
    ${dataDeclarations}
    ${callSequence}
    ${resultCheck}
    ${returnStatements}
  }
)";

    return replaceWithMap( definitionTemplate,
                           { { "argumentList", argumentList },
                             { "callSequence", callSequence },
                             { "className", className },
                             { "commandName", commandName },
                             { "dataDeclarations", dataDeclarations },
                             { "noexcept", noexceptString },
                             { "resultCheck", resultCheck },
                             { "returnStatements", returnStatements },
                             { "returnType", returnType },
                             { "vkCommandName", name } } );
  }
  else
  {
    std::string const declarationTemplate =
      R"(
  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
  VULKAN_HPP_NODISCARD VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::detail::CreateReturnType<${returnType}>::Type ${commandName}( ${argumentList} ) const ${noexcept};
)";

    return replaceWithMap( declarationTemplate,
                           { { "argumentList", argumentList },
                             { "commandName", commandName },
                             { "noexcept", noexceptString },
                             { "returnType", returnType },
                             { "vkCommandName", name } } );
  }
}